

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loslib.c
# Opt level: O2

int os_date(lua_State *L)

{
  lua_State *L_00;
  long lVar1;
  char cVar2;
  int iVar3;
  char *pcVar4;
  tm *__tp;
  char *pcVar5;
  size_t l;
  bool bVar6;
  long lVar7;
  char *pcVar8;
  lua_Number lVar9;
  char cc [4];
  time_t t;
  lua_State *local_2120;
  char buff [200];
  luaL_Buffer b;
  
  pcVar4 = luaL_optlstring(L,1,"%c",(size_t *)0x0);
  iVar3 = lua_type(L,2);
  if (iVar3 < 1) {
    t = time((time_t *)0x0);
  }
  else {
    lVar9 = luaL_checknumber(L,2);
    t = (time_t)lVar9;
  }
  if (*pcVar4 == '!') {
    __tp = gmtime(&t);
    pcVar4 = pcVar4 + 1;
  }
  else {
    __tp = localtime(&t);
  }
  if (__tp == (tm *)0x0) {
    lua_pushnil(L);
  }
  else if (((*pcVar4 == '*') && (pcVar4[1] == 't')) && (pcVar4[2] == '\0')) {
    lua_createtable(L,0,9);
    setfield(L,"sec",__tp->tm_sec);
    setfield(L,"min",__tp->tm_min);
    setfield(L,"hour",__tp->tm_hour);
    setfield(L,"day",__tp->tm_mday);
    setfield(L,"month",__tp->tm_mon + 1);
    setfield(L,"year",__tp->tm_year + 0x76c);
    setfield(L,"wday",__tp->tm_wday + 1);
    setfield(L,"yday",__tp->tm_yday + 1);
    if (-1 < __tp->tm_isdst) {
      lua_pushboolean(L,__tp->tm_isdst);
      lua_setfield(L,-2,"isdst");
    }
  }
  else {
    cc[0] = '%';
    local_2120 = L;
    luaL_buffinit(L,&b);
LAB_001170ad:
    while( true ) {
      cVar2 = *pcVar4;
      if (cVar2 != '%') break;
      pcVar8 = pcVar4 + 1;
      bVar6 = true;
      lVar1 = 0;
      do {
        do {
          lVar7 = lVar1;
          L_00 = local_2120;
          if (!bVar6) {
            pcVar4 = lua_pushfstring(local_2120,"invalid conversion specifier \'%%%s\'",pcVar8);
            luaL_argerror(L_00,1,pcVar4);
            goto LAB_0011717c;
          }
          cVar2 = *pcVar8;
          bVar6 = false;
          lVar1 = 2;
        } while (cVar2 == '\0');
        pcVar5 = strchr((char *)((long)&checkoption_options_rel +
                                (long)(int)(&checkoption_options_rel)[lVar7]),(int)cVar2);
        bVar6 = false;
      } while (pcVar5 == (char *)0x0);
      cc[2] = '\0';
      pcVar8 = pcVar4 + 2;
      cc[1] = cVar2;
LAB_0011717c:
      l = strftime(buff,200,cc,__tp);
      luaL_addlstring(&b,buff,l);
      pcVar4 = pcVar8;
    }
    if (cVar2 != '\0') {
      if (b.size <= b.n) {
        luaL_prepbuffsize(&b,1);
        cVar2 = *pcVar4;
      }
      b.b[b.n] = cVar2;
      pcVar4 = pcVar4 + 1;
      b.n = b.n + 1;
      goto LAB_001170ad;
    }
    luaL_pushresult(&b);
  }
  return 1;
}

Assistant:

static int os_date (lua_State *L) {
  const char *s = luaL_optstring(L, 1, "%c");
  time_t t = luaL_opt(L, (time_t)luaL_checknumber, 2, time(NULL));
  struct tm tmr, *stm;
  if (*s == '!') {  /* UTC? */
    stm = l_gmtime(&t, &tmr);
    s++;  /* skip `!' */
  }
  else
    stm = l_localtime(&t, &tmr);
  if (stm == NULL)  /* invalid date? */
    lua_pushnil(L);
  else if (strcmp(s, "*t") == 0) {
    lua_createtable(L, 0, 9);  /* 9 = number of fields */
    setfield(L, "sec", stm->tm_sec);
    setfield(L, "min", stm->tm_min);
    setfield(L, "hour", stm->tm_hour);
    setfield(L, "day", stm->tm_mday);
    setfield(L, "month", stm->tm_mon+1);
    setfield(L, "year", stm->tm_year+1900);
    setfield(L, "wday", stm->tm_wday+1);
    setfield(L, "yday", stm->tm_yday+1);
    setboolfield(L, "isdst", stm->tm_isdst);
  }
  else {
    char cc[4];
    luaL_Buffer b;
    cc[0] = '%';
    luaL_buffinit(L, &b);
    while (*s) {
      if (*s != '%')  /* no conversion specifier? */
        luaL_addchar(&b, *s++);
      else {
        size_t reslen;
        char buff[200];  /* should be big enough for any conversion result */
        s = checkoption(L, s + 1, cc);
        reslen = strftime(buff, sizeof(buff), cc, stm);
        luaL_addlstring(&b, buff, reslen);
      }
    }
    luaL_pushresult(&b);
  }
  return 1;
}